

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O2

ValueRep __thiscall
Clasp::BasicSolve::State::solve(State *this,Solver *s,SolveParams *p,SolveLimits *lim)

{
  ScheduleStrategy *this_00;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  uint64 uVar6;
  ulong uVar7;
  long lVar8;
  Solver *pSVar9;
  Solver *pSVar10;
  Solver *pSVar11;
  uint uVar12;
  uint uVar13;
  Solver *pSVar14;
  ValueRep VVar15;
  long *plVar16;
  DynamicLimit *this_01;
  Solver *pSVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  DBInfo DVar21;
  Solver *pSStack_130;
  uint local_114;
  RestartSchedule rs;
  ScheduleStrategy local_f8;
  SolveLimits *local_e8;
  uint64 local_e0;
  ReduceStrategy *local_d8;
  uint local_d0;
  ReduceStrategy local_cc;
  SearchLimits local_c8;
  WeightLitVec inDegree;
  EventType progress;
  undefined8 local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined8 uStack_3c;
  
  if (s->enum_ == (Constraint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)*(byte *)((long)&s->enum_[7]._vptr_Constraint + 5);
  }
  if (((s->conflict_).ebo_.size == 0) || ((s->levels_).super_type.ebo_.size != (s->levels_).root)) {
    if (this->resetState == true) {
      ~State(this);
      State(this,s,p);
    }
    inDegree.ebo_.buf = (pointer)0x0;
    inDegree.ebo_.size = 0;
    inDegree.ebo_.cap = 0;
    SearchLimits::SearchLimits(&local_c8);
    rs.super_ScheduleStrategy._0_4_ =
         *(undefined4 *)&(p->restart).rsSched.super_ScheduleStrategy.field_0x0;
    rs.super_ScheduleStrategy.idx = (p->restart).rsSched.super_ScheduleStrategy.idx;
    rs.super_ScheduleStrategy.len = (p->restart).rsSched.super_ScheduleStrategy.len;
    rs.super_ScheduleStrategy.grow = (p->restart).rsSched.super_ScheduleStrategy.grow;
    local_f8 = (p->reduce).growSched;
    local_114 = this->dbPinned;
    this_00 = &this->dbRed;
    uVar6 = ScheduleStrategy::current(this_00);
    uVar3 = this->dbRedInit;
    pSStack_130 = (Solver *)this->dbGrowNext;
    pSVar17 = (Solver *)lim->conflicts;
    local_e0 = lim->restarts;
    if (((undefined1  [16])local_f8 & (undefined1  [16])0x3fffffff) != (undefined1  [16])0x0) {
      ScheduleStrategy::advanceTo(&local_f8,this->nGrow);
    }
    uVar4 = this->nRestart;
    if ((uVar4 == 0xffffffff) &&
       ((*(ulong *)&(p->restart).field_0x18 & 0x3000000000000000) == 0x2000000000000000)) {
      SearchLimits::SearchLimits((SearchLimits *)&progress);
      local_c8.used =
           CONCAT44(progress.super_SolveEvent<Clasp::BasicSolveEvent>._4_4_,
                    CONCAT22(progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                             super_Event_t<Clasp::BasicSolveEvent>.super_Event._2_2_,
                             progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                             super_Event_t<Clasp::BasicSolveEvent>.super_Event._0_2_));
      local_c8.memory._0_4_ = uStack_40;
      local_c8.memory._4_4_ = (undefined4)uStack_3c;
      local_c8.learnts = SUB84(uStack_3c,4);
      local_c8.restart._24_8_ = local_50;
      local_c8.conflicts._0_4_ = uStack_48;
      local_c8.conflicts._4_4_ = uStack_44;
      local_c8.restart.dynamic = (LimitPtr)progress.cLimit;
      local_c8.restart.conflicts = (uint64)progress.super_SolveEvent<Clasp::BasicSolveEvent>.solver;
    }
    else if (((uint)rs.super_ScheduleStrategy._0_4_ < 0xc0000000) ||
            (this_01 = (DynamicLimit *)((this->dynRestart).ptr_ & 0xfffffffffffffffe),
            this_01 == (DynamicLimit *)0x0)) {
      if ((rs.super_ScheduleStrategy._0_8_ & 0x3fffffff) == 0) {
        uVar4 = rs.super_ScheduleStrategy._0_4_ & 0x3fffffff;
      }
      ScheduleStrategy::advanceTo(&rs.super_ScheduleStrategy,uVar4);
      local_c8.restart.conflicts = ScheduleStrategy::current(&rs.super_ScheduleStrategy);
    }
    else {
      if (uVar4 == 0) {
        DynamicLimit::resetAdjust
                  (this_01,rs.super_ScheduleStrategy.grow,lbd_limit,
                   -(uint)(rs.super_ScheduleStrategy.len == 0xffffffff) | 16000,true);
        this_01 = (DynamicLimit *)((this->dynRestart).ptr_ & 0xfffffffffffffffe);
      }
      uVar4 = (this_01->adjust).limit;
      uVar12 = (this_01->adjust).samples;
      uVar13 = uVar4 - 1;
      if (uVar13 < uVar12) {
        uVar12 = uVar13;
      }
      local_c8.restart.conflicts = (uint64)(uVar4 - uVar12);
      local_c8.restart.dynamic = this_01;
    }
    local_c8.restart._24_8_ =
         CONCAT71(local_c8.restart._25_7_,
                  (byte)((ulong)*(undefined8 *)&(p->restart).field_0x18 >> 0x3e)) &
         0xffffffffffffff01;
    local_c8.restart.block = (BlockPtr)((this->rsBlock).ptr_ & 0xfffffffffffffffe);
    uVar7 = (ulong)(p->reduce).memMax;
    if (uVar7 != 0) {
      lVar8 = uVar7 << 0x14;
      local_c8.memory._0_4_ = (undefined4)lVar8;
      local_c8.memory._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
    }
    local_e8 = lim;
    local_d0 = uVar5;
    BasicSolveEvent::BasicSolveEvent(&progress,s,event_restart,0,0);
    pSVar14 = (Solver *)(uVar6 + uVar3);
    local_d8 = &(p->reduce).strategy;
LAB_0015edce:
    if (pSVar17 == (Solver *)0x0) {
      pSVar17 = (Solver *)0x0;
LAB_0015f2c3:
      uVar5 = 0;
    }
    else {
      pSVar9 = (Solver *)
               (-(ulong)((*(ulong *)&(p->restart).field_0x18 & 0x4000000000000000) != 0) |
               local_c8.restart.conflicts);
      local_c8.used = 0;
      dVar18 = (double)((int)(p->reduce).strategy >> 0x1f & local_114) + this->dbMax;
      dVar19 = this->dbHigh;
      if (dVar18 <= this->dbHigh) {
        dVar19 = dVar18;
      }
      local_c8.learnts = (uint32)(long)dVar19;
      if (pSVar17 < pSVar9) {
        pSVar9 = pSVar17;
      }
      progress.cLimit = (uint64)pSVar14;
      if (pSStack_130 < pSVar14) {
        progress.cLimit = (uint64)pSStack_130;
      }
      if (pSVar9 < progress.cLimit) {
        progress.cLimit = (uint64)pSVar9;
      }
      local_c8.conflicts._0_4_ = (undefined4)progress.cLimit;
      local_c8.conflicts._4_4_ = (undefined4)(progress.cLimit >> 0x20);
      progress.lLimit = local_c8.learnts;
      if ((progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
           super_Event._0_2_ & 0xff0) != 0) {
        SharedContext::report(s->shared_,(Event *)&progress);
        uVar5 = CONCAT22(progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                         super_Event_t<Clasp::BasicSolveEvent>.super_Event._2_2_,
                         progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                         super_Event_t<Clasp::BasicSolveEvent>.super_Event._0_2_) & 0xfffff00f;
        progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
        super_Event._0_2_ = SUB42(uVar5,0);
        progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
        super_Event._2_2_ = SUB42(uVar5 >> 0x10,0);
      }
      bVar1 = Solver::search(s,&local_c8,(double)p->randProb);
      uVar5 = (uint)bVar1;
      pSVar9 = (Solver *)local_c8.used;
      if ((Solver *)CONCAT44(local_c8.conflicts._4_4_,(undefined4)local_c8.conflicts) <
          local_c8.used) {
        pSVar9 = (Solver *)CONCAT44(local_c8.conflicts._4_4_,(undefined4)local_c8.conflicts);
      }
      pSStack_130 = (Solver *)((long)pSStack_130 - (long)pSVar9);
      pSVar17 = (Solver *)((long)pSVar17 - (long)pSVar9);
      if (bVar1 == 0) {
        bVar2 = Solver::restartReached(s,&local_c8);
        if (bVar2) {
          uVar3 = this->nRestart + 1;
          this->nRestart = uVar3;
          uVar5 = *(uint *)&(p->restart).field_0x18;
          uVar13 = uVar5 & 0xffff;
          if ((uVar13 != 0) && (uVar3 % uVar13 == 0)) {
            inDegree.ebo_._8_8_ = inDegree.ebo_._8_8_ & 0xffffffff00000000;
            uVar7 = (s->heuristic_).ptr_;
            uVar4 = Solver::inDegree(s,&inDegree);
            plVar16 = (long *)(uVar7 & 0xfffffffffffffffe);
            (**(code **)(*plVar16 + 0x58))
                      ((double)(uVar5 >> 0x10) / (double)uVar4,plVar16,s,&inDegree);
          }
          if (local_c8.restart.dynamic == (DynamicLimit *)0x0) {
            local_c8.restart.conflicts = ScheduleStrategy::next(&rs.super_ScheduleStrategy);
            pSVar11 = (Solver *)local_c8.restart.conflicts;
          }
          else {
            uVar5 = (local_c8.restart.dynamic)->num_;
            uVar4 = DynamicLimit::restart
                              (local_c8.restart.dynamic,rs.super_ScheduleStrategy.len,
                               rs.super_ScheduleStrategy.grow);
            local_c8.restart.conflicts = (uint64)uVar4;
            pSVar11 = (Solver *)(ulong)uVar5;
          }
          Solver::restart(s);
          if (((uint)*local_d8 & 0x1fc0000) != 0) {
            DVar21 = Solver::reduceLearnts
                               (s,(float)((uint)*local_d8 >> 0x12 & 0x7f) / 100.0,local_d8);
            local_114 = DVar21.pinned;
          }
          if (this->nRestart == this->rsShuffle) {
            this->rsShuffle =
                 ((uint)((ulong)*(undefined8 *)&(p->restart).field_0x18 >> 0x2e) & 0x3fff) +
                 this->nRestart;
            s->field_0x207 = s->field_0x207 | 0x40;
          }
          local_e0 = local_e0 - 1;
          if (local_e0 == 0) {
            local_e0 = 0;
            goto LAB_0015f2c3;
          }
          (s->stats).super_CoreStats.lastRestart = (s->stats).super_CoreStats.analyzed;
          uVar5 = CONCAT22(progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                           super_Event_t<Clasp::BasicSolveEvent>.super_Event._2_2_,
                           progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                           super_Event_t<Clasp::BasicSolveEvent>.super_Event._0_2_) & 0xfffff00f;
          progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
          super_Event._0_2_ = (ushort)uVar5 | 0x520;
          progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
          super_Event._2_2_ = SUB42(uVar5 >> 0x10,0);
        }
        else {
          pSVar11 = pSVar9;
          if ((*(ulong *)&(p->restart).field_0x18 & 0x4000000000000000) == 0) {
            bVar2 = pSVar9 <= local_c8.restart.conflicts;
            pSVar10 = (Solver *)(local_c8.restart.conflicts - (long)pSVar9);
            local_c8.restart.conflicts = (uint64)(Solver *)0x0;
            if (bVar2) {
              local_c8.restart.conflicts = (uint64)pSVar10;
            }
          }
        }
        pSVar14 = (Solver *)((long)pSVar14 - (long)pSVar9);
        if ((pSVar14 == (Solver *)0x0) || (bVar2 = Solver::reduceReached(s,&local_c8), bVar2)) {
          DVar21 = Solver::reduceLearnts(s,(float)((uint)*local_d8 >> 0xb & 0x7f) / 100.0,local_d8);
          local_114 = DVar21.pinned;
          uVar5 = this->dbRedInit;
          if (pSVar14 == (Solver *)0x0) {
            uVar6 = ScheduleStrategy::next(this_00);
          }
          else {
            uVar6 = ScheduleStrategy::current(this_00);
          }
          uVar3 = ((ushort)progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                           super_Event_t<Clasp::BasicSolveEvent>.super_Event._0_2_ & 0xff0) >> 4;
          if (uVar3 < 0x45) {
            uVar3 = 0x44;
          }
          uVar13 = CONCAT22(progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                            super_Event_t<Clasp::BasicSolveEvent>.super_Event._2_2_,
                            progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                            super_Event_t<Clasp::BasicSolveEvent>.super_Event._0_2_) & 0xfffff00f;
          progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
          super_Event._0_2_ = (ushort)uVar13 | (ushort)(uVar3 << 4);
          progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
          super_Event._2_2_ = SUB42(uVar13 >> 0x10,0);
          bVar2 = Solver::reduceReached(s,&local_c8);
          pSVar14 = (Solver *)(uVar6 + uVar5);
          if ((bVar2) || (this->dbMax <= (double)local_114)) {
            local_cc = (ReduceStrategy)0x14025800;
            DVar21 = Solver::reduceLearnts(s,0.5,&local_cc);
            if (local_c8.learnts <= DVar21.size) {
              dVar19 = (double)(s->learnts_).ebo_.size / 10.0;
              if (dVar19 <= 100.0) {
                dVar19 = 100.0;
              }
              dVar19 = dVar19 + this->dbMax;
              dVar18 = this->dbHigh;
              if (dVar19 <= this->dbHigh) {
                dVar18 = dVar19;
              }
              this->dbMax = dVar18;
            }
            local_114 = local_114 >> 1;
          }
        }
        if (pSStack_130 != (Solver *)0x0) goto code_r0x0015f187;
        pSVar11 = (Solver *)ScheduleStrategy::next(&local_f8);
        this->nGrow = this->nGrow + 1;
        pSStack_130 = pSVar11;
        goto LAB_0015f1cd;
      }
      uVar3 = CONCAT22(progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                       super_Event_t<Clasp::BasicSolveEvent>.super_Event._2_2_,
                       progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                       super_Event_t<Clasp::BasicSolveEvent>.super_Event._0_2_) & 0xfffff00f;
      progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
      super_Event._0_2_ = (ushort)uVar3 | 0x450;
      progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
      super_Event._2_2_ = SUB42(uVar3 >> 0x10,0);
      if (bVar1 == 1) {
        uVar3 = (uint)((ulong)*(undefined8 *)&(p->restart).field_0x18 >> 0x3c) & 3;
        if (uVar3 == 1) {
          uVar4 = 0;
        }
        else {
          if (uVar3 != 2) goto LAB_0015f2cd;
          uVar4 = 0xffffffff;
        }
        this->nRestart = uVar4;
      }
LAB_0015f2cd:
      if (((undefined1  [16])local_f8 & (undefined1  [16])0x3fffffff) != (undefined1  [16])0x0) {
        this->dbGrowNext = (long)&(pSStack_130->rng).seed_ + (ulong)(pSStack_130 == (Solver *)0x0);
      }
      SharedContext::report(s->shared_,(Event *)&progress);
    }
    VVar15 = (ValueRep)uVar5;
    this->dbPinned = local_114;
    this->resetState = (local_d0 & uVar5) != 0;
    (s->stats).super_CoreStats.lastRestart =
         (s->stats).super_CoreStats.analyzed - (s->stats).super_CoreStats.lastRestart;
    if ((local_e8->conflicts & local_e8->restarts) != 0xffffffffffffffff) {
      if (local_e8->conflicts != 0xffffffffffffffff) {
        local_e8->conflicts = (uint64)pSVar17;
      }
      if (local_e8->restarts != 0xffffffffffffffff) {
        local_e8->restarts = local_e0;
      }
    }
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    ebo::~ebo(&inDegree.ebo_);
  }
  else {
    this->resetState = (bool)(this->resetState | (byte)((uVar5 & 2) >> 1));
    VVar15 = '\x02';
  }
  return VVar15;
code_r0x0015f187:
  if ((local_f8._0_4_ == 0x40000000) &&
     ((progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
       super_Event._0_2_ & 0xff0) == 0x520)) {
LAB_0015f1cd:
    lVar8 = (long)&(pSVar11->rng).seed_ + (ulong)(s->learnts_).ebo_.size;
    auVar20._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar20._0_8_ = lVar8;
    auVar20._12_4_ = 0x45300000;
    dVar19 = this->dbMax;
    if (dVar19 < (auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) {
      dVar19 = dVar19 * (double)(p->reduce).fGrow;
      this->dbMax = dVar19;
      uVar5 = ((ushort)progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                       super_Event_t<Clasp::BasicSolveEvent>.super_Event._0_2_ & 0xff0) >> 4;
      if (uVar5 < 0x48) {
        uVar5 = 0x47;
      }
      uVar3 = CONCAT22(progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                       super_Event_t<Clasp::BasicSolveEvent>.super_Event._2_2_,
                       progress.super_SolveEvent<Clasp::BasicSolveEvent>.
                       super_Event_t<Clasp::BasicSolveEvent>.super_Event._0_2_) & 0xfffff00f;
      progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
      super_Event._0_2_ = (ushort)uVar3 | (ushort)(uVar5 << 4);
      progress.super_SolveEvent<Clasp::BasicSolveEvent>.super_Event_t<Clasp::BasicSolveEvent>.
      super_Event._2_2_ = SUB42(uVar3 >> 0x10,0);
    }
    if (this->dbHigh < dVar19) {
      this->dbMax = this->dbHigh;
      local_f8 = ScheduleStrategy::none();
      pSStack_130 = (Solver *)0xffffffffffffffff;
    }
  }
  goto LAB_0015edce;
}

Assistant:

ValueRep BasicSolve::State::solve(Solver& s, const SolveParams& p, SolveLimits& lim) {
	assert(!lim.reached());
	const uint32 resetMode = s.enumerationConstraint() ? static_cast<const EnumerationConstraint*>(s.enumerationConstraint())->resetMode() : 0u;
	if (s.hasConflict() && s.decisionLevel() == s.rootLevel()) {
		resetState = resetState || (resetMode & value_false) != 0;
		return value_false;
	}
	struct ConflictLimits {
		uint64 reduce;  // current reduce limit
		uint64 grow;    // current limit for next growth operation
		uint64 restart; // current restart limit
		uint64 global;  // current global limit
		uint64 min()      const { return std::min(std::min(reduce, grow), std::min(restart, global)); }
		void  update(uint64 x)  { reduce -= x; grow -= x; restart -= x; global -= x; }
	};
	if (resetState) {
		this->~State();
		new (this) State(s, p);
	}
	WeightLitVec inDegree;
	SearchLimits     sLimit;
	RestartSchedule  rs     = p.restart.rsSched;
	ScheduleStrategy dbGrow = p.reduce.growSched;
	Solver::DBInfo   db     = {0,0,dbPinned};
	ValueRep         result = value_free;
	ConflictLimits   cLimit = {dbRed.current() + dbRedInit, dbGrowNext, UINT64_MAX, lim.conflicts};
	uint64      limRestarts = lim.restarts;
	if (!dbGrow.disabled())  { dbGrow.advanceTo(nGrow); }
	if (nRestart == UINT32_MAX && p.restart.update() == RestartParams::seq_disable) {
		sLimit = SearchLimits();
	}
	else if (rs.isDynamic() && dynRestart.get()) {
		if (!nRestart) dynRestart->resetAdjust(rs.k(), DynamicLimit::lbd_limit, rs.adjustLim(), true);
		sLimit.restart.dynamic   = dynRestart.get();
		sLimit.restart.conflicts = dynRestart->adjust.limit - std::min(dynRestart->adjust.samples, dynRestart->adjust.limit - 1);
	}
	else {
		rs.advanceTo(!rs.disabled() ? nRestart : 0);
		sLimit.restart.conflicts = rs.current();
	}
	sLimit.restart.local = p.restart.local();
	sLimit.restart.block = rsBlock.get();
	if (p.reduce.memMax) {
		sLimit.memory = static_cast<uint64>(p.reduce.memMax)<<20;
	}
	uint64 n = 0;
	for (EventType progress(s, EventType::event_restart, 0, 0); cLimit.global; ) {
		cLimit.restart   = !p.restart.local() ? sLimit.restart.conflicts : UINT64_MAX;
		sLimit.used      = 0;
		sLimit.learnts   = (uint32)std::min(dbMax + (db.pinned*p.reduce.strategy.noGlue), dbHigh);
		sLimit.conflicts = cLimit.min(); assert(sLimit.conflicts);
		progress.cLimit  = sLimit.conflicts;
		progress.lLimit  = sLimit.learnts;
		if (progress.op) { s.sharedContext()->report(progress); progress.op = (uint32)EventType::event_none; }
		result = s.search(sLimit, p.randProb);
		cLimit.update(n = std::min(sLimit.used, sLimit.conflicts)); // number of conflicts in this iteration
		if (result != value_free) {
			progress.op = static_cast<uint32>(EventType::event_exit);
			if (result == value_true && p.restart.update() != RestartParams::seq_continue) {
				if      (p.restart.update() == RestartParams::seq_repeat) { nRestart = 0; }
				else if (p.restart.update() == RestartParams::seq_disable){ nRestart = UINT32_MAX; }
			}
			if (!dbGrow.disabled()) { dbGrowNext = std::max(cLimit.grow, uint64(1)); }
			s.sharedContext()->report(progress);
			break;
		}
		if (s.restartReached(sLimit)) {
			// restart reached - do restart
			++nRestart;
			if (p.restart.counterRestart && (nRestart % p.restart.counterRestart) == 0 ) {
				inDegree.clear();
				s.heuristic()->bump(s, inDegree, p.restart.counterBump / (double)s.inDegree(inDegree));
			}
			if (sLimit.restart.dynamic) {
				n = sLimit.restart.dynamic->runLen();
				sLimit.restart.conflicts = sLimit.restart.dynamic->restart(rs.lbdLim(), rs.k());
			}
			else {
				sLimit.restart.conflicts = n = rs.next();
			}
			s.restart();
			if (p.reduce.strategy.fRestart){ db        = s.reduceLearnts(p.reduce.fRestart(), p.reduce.strategy); }
			if (nRestart == rsShuffle)     { rsShuffle+= p.restart.shuffleNext; s.shuffleOnNextSimplify();}
			if (--limRestarts == 0)        { break; }
			s.stats.lastRestart = s.stats.analyzed;
			progress.op         = (uint32)EventType::event_restart;
		}
		else if (!p.restart.local()) {
			sLimit.restart.conflicts -= std::min(n, sLimit.restart.conflicts);
		}
		if (cLimit.reduce == 0 || s.reduceReached(sLimit)) {
			// reduction reached - remove learnt constraints
			db              = s.reduceLearnts(p.reduce.fReduce(), p.reduce.strategy);
			cLimit.reduce   = dbRedInit + (cLimit.reduce == 0 ? dbRed.next() : dbRed.current());
			progress.op     = std::max(progress.op, (uint32)EventType::event_deletion);
			if (s.reduceReached(sLimit) || db.pinned >= dbMax) {
				ReduceStrategy t; t.algo = 2; t.score = 2; t.glue = 0;
				db.pinned /= 2;
				db.size    = s.reduceLearnts(0.5f, t).size;
				if (db.size >= sLimit.learnts) { dbMax = std::min(dbMax + std::max(100.0, s.numLearntConstraints()/10.0), dbHigh); }
			}
		}
		if (cLimit.grow == 0 || (dbGrow.defaulted() && progress.op == (uint32)EventType::event_restart)) {
			// grow sched reached - increase max db size
			if (cLimit.grow == 0)                      { cLimit.grow = n = dbGrow.next(); ++nGrow; }
			if ((s.numLearntConstraints() + n) > dbMax){ dbMax  *= p.reduce.fGrow; progress.op = std::max(progress.op, (uint32)EventType::event_grow); }
			if (dbMax > dbHigh)                        { dbMax   = dbHigh; cLimit.grow = UINT64_MAX; dbGrow = ScheduleStrategy::none(); }
		}
	}
	dbPinned            = db.pinned;
	resetState          = (resetMode & result) != 0u;
	s.stats.lastRestart = s.stats.analyzed - s.stats.lastRestart;
	if (lim.enabled()) {
		if (lim.conflicts != UINT64_MAX) { lim.conflicts = cLimit.global; }
		if (lim.restarts  != UINT64_MAX) { lim.restarts  = limRestarts;   }
	}
	return result;
}